

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_get(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *self_00;
  SQObjectPtr *key;
  SQObjectPtr *obj;
  SQObjectPtr *self;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  self_00 = stack_get(v,idx);
  key = SQVM::GetUp(v,-1);
  bVar1 = SQVM::Get(v,self_00,key,key,0,0x29a);
  if (bVar1) {
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    SQVM::Pop(v);
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_get(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    SQObjectPtr &obj = v->GetUp(-1);
    if(v->Get(self,obj,obj,false,DONT_FALL_BACK))
        return SQ_OK;
    v->Pop();
    return SQ_ERROR;
}